

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_tests.c
# Opt level: O1

void cjson_set_valuestring_should_return_null_if_strings_overlap(void)

{
  int iVar1;
  cJSON *object;
  char *pcVar2;
  char *pcVar3;
  
  object = cJSON_ParseWithLengthOpts("\"foo0z\"",8,(char **)0x0,0);
  pcVar2 = cJSON_SetValuestring(object,"abcde");
  pcVar3 = cJSON_SetValuestring(object,pcVar2 + 1);
  iVar1 = strcmp(pcVar2 + 1,"bcde");
  if (iVar1 != 0) {
    UnityFail(" Expected TRUE Was FALSE",0x1f8);
  }
  if (pcVar3 != (char *)0x0) {
    UnityFail(" Expected NULL",0x1f9);
  }
  cJSON_Delete(object);
  return;
}

Assistant:

static void cjson_set_valuestring_should_return_null_if_strings_overlap(void)
{       
    cJSON *obj;
    char* str;
    char* str2;

    obj =  cJSON_Parse("\"foo0z\"");
    
    str =  cJSON_SetValuestring(obj, "abcde");
    str += 1;
    /* The string passed to strcpy overlap which is not allowed.*/
    str2 = cJSON_SetValuestring(obj, str);
    /* If it overlaps, the string will be messed up.*/
    TEST_ASSERT_TRUE(strcmp(str, "bcde") == 0);
    TEST_ASSERT_NULL(str2);
    cJSON_Delete(obj);
}